

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O1

Bool ParseString(TidyDocImpl *doc,TidyOptionImpl *option)

{
  StreamIn *pSVar1;
  tchar tVar2;
  uint uVar3;
  Bool BVar4;
  ulong uVar5;
  tchar tVar6;
  bool bVar7;
  bool bVar8;
  tmbchar buf [8192];
  tmbchar local_2038 [8200];
  
  tVar2 = SkipWhite(&doc->config);
  if ((tVar2 == 0x27) || (tVar6 = 0, uVar3 = tVar2, tVar2 == 0x22)) {
    if ((doc->config).c != 0xffffffff) {
      pSVar1 = (doc->config).cfgIn;
      if (pSVar1 == (StreamIn *)0x0) {
        uVar3 = 0xffffffff;
      }
      else {
        uVar3 = prvTidyReadChar(pSVar1);
      }
      (doc->config).c = uVar3;
    }
    uVar3 = (doc->config).c;
    tVar6 = tVar2;
  }
  bVar8 = true;
  uVar5 = 0;
  bVar7 = false;
  do {
    while( true ) {
      if (((uVar3 + 1 < 0xf) && ((0x4801U >> (uVar3 + 1 & 0x1f) & 1) != 0)) ||
         ((tVar6 != 0 && (uVar3 == tVar6)))) goto LAB_001563c8;
      BVar4 = prvTidyIsWhite(uVar3);
      if (BVar4 != no) break;
LAB_0015636c:
      local_2038[uVar5] = (tmbchar)uVar3;
      if ((doc->config).c != 0xffffffff) {
        pSVar1 = (doc->config).cfgIn;
        if (pSVar1 == (StreamIn *)0x0) {
          uVar3 = 0xffffffff;
        }
        else {
          uVar3 = prvTidyReadChar(pSVar1);
        }
        (doc->config).c = uVar3;
      }
      bVar8 = uVar5 < 0x1ffd;
      uVar5 = uVar5 + 1;
      uVar3 = (doc->config).c;
      bVar7 = true;
      if (uVar5 == 0x1ffe) {
        uVar5 = 0x1ffe;
        goto LAB_001563cb;
      }
    }
    if (bVar7) {
      uVar3 = 0x20;
      goto LAB_0015636c;
    }
    if ((doc->config).c != 0xffffffff) {
      pSVar1 = (doc->config).cfgIn;
      if (pSVar1 == (StreamIn *)0x0) {
        uVar3 = 0xffffffff;
      }
      else {
        uVar3 = prvTidyReadChar(pSVar1);
      }
      (doc->config).c = uVar3;
    }
    uVar3 = (doc->config).c;
    bVar7 = false;
  } while (bVar8);
LAB_001563c8:
  uVar5 = uVar5 & 0xffffffff;
LAB_001563cb:
  local_2038[uVar5] = '\0';
  SetOptionValue(doc,option->id,local_2038);
  return yes;
}

Assistant:

Bool ParseString( TidyDocImpl* doc, const TidyOptionImpl* option )
{
    TidyConfigImpl* cfg = &doc->config;
    tmbchar buf[8192];
    uint i = 0;
    tchar delim = 0;
    Bool waswhite = yes;

    tchar c = SkipWhite( cfg );

    if ( c == '"' || c == '\'' )
    {
        delim = c;
        c = AdvanceChar( cfg );
    }

    while ( i < sizeof(buf)-2 && c != EndOfStream && c != '\r' && c != '\n' )
    {
        if ( delim && c == delim )
            break;

        if ( TY_(IsWhite)(c) )
        {
            if ( waswhite )
            {
                c = AdvanceChar( cfg );
                continue;
            }
            c = ' ';
        }
        else
            waswhite = no;

        buf[i++] = (tmbchar) c;
        c = AdvanceChar( cfg );
    }
    buf[i] = '\0';

    SetOptionValue( doc, option->id, buf );
    return yes;
}